

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

void __thiscall
Js::FunctionProxy::SetOriginalEntryPoint(FunctionProxy *this,JavascriptMethod originalEntryPoint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *this_00;
  
  this_00 = (this->functionInfo).ptr;
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_006da695;
    *puVar3 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  if ((this_00->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_006da695:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  FunctionInfo::SetOriginalEntryPoint(this_00,originalEntryPoint);
  return;
}

Assistant:

inline void FunctionProxy::SetOriginalEntryPoint(const JavascriptMethod originalEntryPoint)
    {
        Assert(GetFunctionInfo());
        Assert(GetFunctionInfo()->GetFunctionProxy() == this);
        GetFunctionInfo()->SetOriginalEntryPoint(originalEntryPoint);
    }